

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O1

int pmain(lua_State *L)

{
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t len;
  uint nrec;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  long *plVar11;
  long lVar12;
  bool bVar13;
  
  puVar2 = smain_0;
  pcVar5 = (char *)*smain_0;
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    progname = pcVar5;
  }
  globalL = L;
  luaJIT_version_2_1_0_beta3();
  pcVar5 = (char *)puVar2[1];
  nrec = 1;
  uVar7 = 0;
  if (pcVar5 != (char *)0x0) {
LAB_00109c53:
    if (*pcVar5 != '-') goto LAB_00109ce5;
    bVar1 = pcVar5[1];
    if (bVar1 < 0x4f) {
      if (bVar1 == 0x45) {
        uVar7 = uVar7 | 0x10;
        goto LAB_00109cb9;
      }
      if (bVar1 != 0) {
        if (bVar1 != 0x2d) goto switchD_00109c74_caseD_63;
        nrec = nrec + 1 | -(uint)(pcVar5[2] != '\0');
      }
      goto LAB_00109ce5;
    }
    switch(bVar1) {
    case 0x62:
      uVar10 = 4;
      if (uVar7 != 0) {
        uVar10 = uVar7;
      }
      nrec = nrec + 1 | -(uint)(uVar7 != 0);
      uVar7 = uVar10;
      goto LAB_00109ce5;
    case 99:
    case 100:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6b:
      break;
    case 0x65:
      uVar7 = uVar7 | 4;
    case 0x6a:
    case 0x6c:
      uVar7 = uVar7 | 8;
      if (pcVar5[2] == '\0') {
        if (puVar2[(long)(int)nrec + 1] == 0) break;
        nrec = nrec + 1;
      }
LAB_00109cb9:
      lVar12 = (long)(int)nrec;
      nrec = nrec + 1;
      pcVar5 = (char *)puVar2[lVar12 + 1];
      if (pcVar5 == (char *)0x0) goto LAB_00109ce5;
      goto LAB_00109c53;
    case 0x69:
      if (pcVar5[2] == '\0') {
        uVar7 = uVar7 | 1;
LAB_00109cb0:
        if (pcVar5[2] == '\0') {
          uVar7 = uVar7 | 2;
          goto LAB_00109cb9;
        }
      }
      break;
    default:
      if (bVar1 == 0x4f) goto LAB_00109cb9;
      if (bVar1 == 0x76) goto LAB_00109cb0;
    }
switchD_00109c74_caseD_63:
    nrec = 0xffffffff;
  }
LAB_00109ce5:
  if ((int)nrec < 0) {
    pmain_cold_1();
    return 0;
  }
  if ((uVar7 & 0x10) != 0) {
    lua_pushboolean(L,1);
    lua_setfield(L,-10000,"LUA_NOENV");
  }
  lua_gc(L,0,0);
  luaL_openlibs(L);
  lua_gc(L,1,-1);
  lVar12 = (long)(int)smain_1;
  lua_createtable(L,smain_1 - nrec,nrec);
  if (0 < lVar12) {
    lVar9 = 0;
    do {
      lua_pushstring(L,(char *)puVar2[lVar9]);
      lua_rawseti(L,-2,(int)lVar9 - nrec);
      lVar9 = lVar9 + 1;
    } while (lVar12 != lVar9);
  }
  lua_setfield(L,-0x2712,"arg");
  if ((uVar7 & 0x10) == 0) {
    pcVar5 = getenv("LUA_INIT");
    if (pcVar5 == (char *)0x0) {
      smain_2 = 0;
    }
    else if (*pcVar5 == '@') {
      smain_2 = dofile(L,pcVar5 + 1);
    }
    else {
      smain_2 = dostring(L,pcVar5,"=LUA_INIT");
    }
    if (smain_2 != 0) {
      return 0;
    }
  }
  if ((uVar7 & 2) != 0) {
    fputs("LuaJIT 2.1.0-beta3 -- Copyright (C) 2005-2021 Mike Pall. https://luajit.org/\n",_stdout);
  }
  if (1 < (int)nrec) {
    iVar8 = 1;
    do {
      lVar12 = puVar2[iVar8];
      if (lVar12 != 0) {
        bVar1 = *(byte *)(lVar12 + 1);
        iVar4 = iVar8;
        if (bVar1 < 0x6a) {
          if (bVar1 == 0x4f) {
            pcVar5 = (char *)(lVar12 + 2);
            lua_getfield(L,-10000,"_LOADED");
            lua_getfield(L,-1,"jit.opt");
            lua_remove(L,-2);
            lua_getfield(L,-1,"start");
            lua_remove(L,-2);
LAB_00109ffe:
            iVar3 = runcmdopt(L,pcVar5);
            iVar8 = iVar4;
          }
          else {
            if (bVar1 != 0x65) {
              if (bVar1 == 0x62) {
                lua_pushlstring(L,"bcsave",6);
                iVar4 = loadjitmodule(L);
                if (iVar4 == 0) {
                  bVar13 = *(char *)(puVar2[iVar8] + 2) != '\0';
                  if (bVar13) {
                    *(undefined1 *)(puVar2[iVar8] + 1) = 0x2d;
                    lua_pushstring(L,(char *)(puVar2[iVar8] + 1));
                  }
                  uVar7 = (uint)bVar13;
                  pcVar5 = (char *)puVar2[(long)iVar8 + 1];
                  if (pcVar5 != (char *)0x0) {
                    plVar11 = puVar2 + (long)iVar8 + 2;
                    do {
                      lua_pushstring(L,pcVar5);
                      uVar7 = uVar7 + 1;
                      pcVar5 = (char *)*plVar11;
                      plVar11 = plVar11 + 1;
                    } while (pcVar5 != (char *)0x0);
                  }
                  iVar8 = lua_pcall(L,uVar7,0,0);
                  report(L,iVar8);
                  smain_2 = 0xffffffff;
                  return 0;
                }
                smain_2 = 1;
                return 0;
              }
              goto LAB_0010a062;
            }
            if (*(char *)(lVar12 + 2) == '\0') {
              iVar4 = iVar8 + 1;
              pcVar5 = (char *)puVar2[(long)iVar8 + 1];
            }
            else {
              pcVar5 = (char *)(lVar12 + 2);
            }
            iVar3 = dostring(L,pcVar5,"=(command line)");
            iVar8 = iVar4;
          }
          if (iVar3 != 0) {
            smain_2 = 1;
            return 0;
          }
        }
        else {
          if (bVar1 == 0x6a) {
            if (*(char *)(lVar12 + 2) == '\0') {
              iVar4 = iVar8 + 1;
              pcVar5 = (char *)puVar2[(long)iVar8 + 1];
            }
            else {
              pcVar5 = (char *)(lVar12 + 2);
            }
            pcVar6 = strchr(pcVar5,0x3d);
            if (pcVar6 == (char *)0x0) {
              len = strlen(pcVar5);
            }
            else {
              len = (long)pcVar6 - (long)pcVar5;
            }
            lua_pushlstring(L,pcVar5,len);
            lua_getfield(L,-10000,"_LOADED");
            lua_getfield(L,-1,"jit");
            lua_remove(L,-2);
            lua_pushvalue(L,-2);
            lua_gettable(L,-2);
            iVar8 = lua_type(L,-1);
            if (iVar8 == 6) {
              lua_remove(L,-2);
            }
            else {
              lua_settop(L,-3);
              iVar8 = loadjitmodule(L);
              if (iVar8 != 0) {
                smain_2 = 1;
                return 0;
              }
            }
            lua_remove(L,-2);
            pcVar5 = pcVar6 + 1;
            if (pcVar6 == (char *)0x0) {
              pcVar5 = (char *)0x0;
            }
            goto LAB_00109ffe;
          }
          if (bVar1 == 0x6c) {
            if (*(char *)(lVar12 + 2) == '\0') {
              pcVar5 = (char *)puVar2[(long)iVar8 + 1];
              iVar8 = iVar8 + 1;
            }
            else {
              pcVar5 = (char *)(lVar12 + 2);
            }
            lua_getfield(L,-0x2712,"require");
            lua_pushstring(L,pcVar5);
            iVar4 = docall(L,1,1);
            report(L,iVar4);
            if (iVar4 != 0) {
              smain_2 = 1;
              return 0;
            }
          }
        }
      }
LAB_0010a062:
      iVar8 = iVar8 + 1;
    } while (iVar8 < (int)nrec);
  }
  smain_2 = 0;
  if ((int)nrec < (int)smain_1) {
    pcVar5 = (char *)puVar2[nrec];
    iVar8 = strcmp(pcVar5,"-");
    if ((iVar8 == 0) && (iVar8 = strcmp((char *)puVar2[(ulong)nrec - 1],"--"), iVar8 != 0)) {
      pcVar5 = (char *)0x0;
    }
    iVar8 = luaL_loadfile(L,pcVar5);
    if (iVar8 == 0) {
      lua_getfield(L,-0x2712,"arg");
      iVar8 = lua_type(L,-1);
      if (iVar8 == 5) {
        uVar10 = 0;
        iVar8 = 1;
        do {
          uVar10 = uVar10 - 1;
          lua_rawgeti(L,uVar10,iVar8);
          iVar4 = lua_type(L,-1);
          iVar8 = iVar8 + 1;
        } while (iVar4 != 0);
        lua_settop(L,-2);
        lua_remove(L,uVar10);
        uVar10 = ~uVar10;
      }
      else {
        lua_settop(L,-2);
        uVar10 = 0;
      }
      iVar8 = docall(L,uVar10,0);
    }
    report(L,iVar8);
    smain_2 = iVar8;
    if (iVar8 != 0) {
      return 0;
    }
  }
  if ((uVar7 & 1) == 0) {
    if ((uVar7 & 6) != 0) {
      return 0;
    }
    if (smain_1 != nrec) {
      return 0;
    }
    iVar8 = isatty(0);
    if (iVar8 == 0) {
      dofile(L,(char *)0x0);
      return 0;
    }
    fputs("LuaJIT 2.1.0-beta3 -- Copyright (C) 2005-2021 Mike Pall. https://luajit.org/\n",_stdout);
  }
  print_jit_status(L);
  dotty(L);
  return 0;
}

Assistant:

static int pmain(lua_State *L)
{
  struct Smain *s = &smain;
  char **argv = s->argv;
  int argn;
  int flags = 0;
  globalL = L;
  if (argv[0] && argv[0][0]) progname = argv[0];

  LUAJIT_VERSION_SYM();  /* Linker-enforced version check. */

  argn = collectargs(argv, &flags);
  if (argn < 0) {  /* Invalid args? */
    print_usage();
    s->status = 1;
    return 0;
  }

  if ((flags & FLAGS_NOENV)) {
    lua_pushboolean(L, 1);
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }

  /* Stop collector during library initialization. */
  lua_gc(L, LUA_GCSTOP, 0);
  luaL_openlibs(L);
  lua_gc(L, LUA_GCRESTART, -1);

  createargtable(L, argv, s->argc, argn);

  if (!(flags & FLAGS_NOENV)) {
    s->status = handle_luainit(L);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_VERSION)) print_version();

  s->status = runargs(L, argv, argn);
  if (s->status != LUA_OK) return 0;

  if (s->argc > argn) {
    s->status = handle_script(L, argv + argn);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_INTERACTIVE)) {
    print_jit_status(L);
    dotty(L);
  } else if (s->argc == argn && !(flags & (FLAGS_EXEC|FLAGS_VERSION))) {
    if (lua_stdin_is_tty()) {
      print_version();
      print_jit_status(L);
      dotty(L);
    } else {
      dofile(L, NULL);  /* Executes stdin as a file. */
    }
  }
  return 0;
}